

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_subject_alt_name_ext
              (uchar **p,uchar *end,mbedtls_x509_sequence *subject_alt_name)

{
  int iVar1;
  void *pvVar2;
  undefined1 local_a8 [8];
  mbedtls_x509_buf tmp_san_buf;
  mbedtls_x509_subject_alternative_name tmp_san_name;
  mbedtls_asn1_sequence *cur;
  size_t tag_len;
  mbedtls_x509_sequence *pmStack_28;
  int ret;
  mbedtls_x509_sequence *subject_alt_name_local;
  uchar *end_local;
  uchar **p_local;
  
  tag_len._4_4_ = -0x6e;
  tmp_san_name.san._64_8_ = subject_alt_name;
  pmStack_28 = subject_alt_name;
  subject_alt_name_local = (mbedtls_x509_sequence *)end;
  end_local = (uchar *)p;
  while( true ) {
    if (subject_alt_name_local <= *(mbedtls_x509_sequence **)end_local) {
      *(undefined8 *)(tmp_san_name.san._64_8_ + 0x18) = 0;
      if (*(mbedtls_x509_sequence **)end_local == subject_alt_name_local) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ =
             mbedtls_error_add(-0x2500,-0x66,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                               ,0x503);
      }
      return p_local._4_4_;
    }
    memset(&tmp_san_buf.p,0,0x50);
    local_a8._0_4_ = ZEXT14(**(byte **)end_local);
    *(long *)end_local = *(long *)end_local + 1;
    tag_len._4_4_ =
         mbedtls_asn1_get_len((uchar **)end_local,(uchar *)subject_alt_name_local,(size_t *)&cur);
    if (tag_len._4_4_ != 0) {
      iVar1 = mbedtls_error_add(-0x2500,tag_len._4_4_,
                                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                                ,0x4ce);
      return iVar1;
    }
    tmp_san_buf.len = *(size_t *)end_local;
    tmp_san_buf._0_8_ = cur;
    if ((local_a8._0_4_ & 0xc0) != 0x80) {
      iVar1 = mbedtls_error_add(-0x2500,-0x62,
                                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                                ,0x4d7);
      return iVar1;
    }
    tag_len._4_4_ =
         mbedtls_x509_parse_subject_alt_name
                   ((mbedtls_x509_buf *)local_a8,
                    (mbedtls_x509_subject_alternative_name *)&tmp_san_buf.p);
    if ((tag_len._4_4_ != 0) && (tag_len._4_4_ != -0x2080)) break;
    mbedtls_x509_free_subject_alt_name((mbedtls_x509_subject_alternative_name *)&tmp_san_buf.p);
    if (*(long *)(tmp_san_name.san._64_8_ + 0x10) != 0) {
      if (*(long *)(tmp_san_name.san._64_8_ + 0x18) != 0) {
        return -0x2500;
      }
      pvVar2 = calloc(1,0x20);
      *(void **)(tmp_san_name.san._64_8_ + 0x18) = pvVar2;
      if (*(long *)(tmp_san_name.san._64_8_ + 0x18) == 0) {
        iVar1 = mbedtls_error_add(-0x2500,-0x6a,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                                  ,0x4f4);
        return iVar1;
      }
      tmp_san_name.san._64_8_ = *(undefined8 *)(tmp_san_name.san._64_8_ + 0x18);
    }
    *(ulong *)tmp_san_name.san._64_8_ = CONCAT44(local_a8._4_4_,local_a8._0_4_);
    *(undefined8 *)(tmp_san_name.san._64_8_ + 8) = tmp_san_buf._0_8_;
    *(size_t *)(tmp_san_name.san._64_8_ + 0x10) = tmp_san_buf.len;
    *(long *)end_local = tmp_san_buf._0_8_ + *(long *)end_local;
  }
  mbedtls_asn1_sequence_free(pmStack_28->next);
  pmStack_28->next = (mbedtls_asn1_sequence *)0x0;
  return tag_len._4_4_;
}

Assistant:

int mbedtls_x509_get_subject_alt_name_ext(unsigned char **p,
                                          const unsigned char *end,
                                          mbedtls_x509_sequence *subject_alt_name)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t tag_len;
    mbedtls_asn1_sequence *cur = subject_alt_name;

    while (*p < end) {
        mbedtls_x509_subject_alternative_name tmp_san_name;
        mbedtls_x509_buf tmp_san_buf;
        memset(&tmp_san_name, 0, sizeof(tmp_san_name));

        tmp_san_buf.tag = **p;
        (*p)++;

        if ((ret = mbedtls_asn1_get_len(p, end, &tag_len)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        tmp_san_buf.p = *p;
        tmp_san_buf.len = tag_len;

        if ((tmp_san_buf.tag & MBEDTLS_ASN1_TAG_CLASS_MASK) !=
            MBEDTLS_ASN1_CONTEXT_SPECIFIC) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                     MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
        }

        /*
         * Check that the SAN is structured correctly by parsing it.
         * The SAN structure is discarded afterwards.
         */
        ret = mbedtls_x509_parse_subject_alt_name(&tmp_san_buf, &tmp_san_name);
        /*
         * In case the extension is malformed, return an error,
         * and clear the allocated sequences.
         */
        if (ret != 0 && ret != MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) {
            mbedtls_asn1_sequence_free(subject_alt_name->next);
            subject_alt_name->next = NULL;
            return ret;
        }

        mbedtls_x509_free_subject_alt_name(&tmp_san_name);
        /* Allocate and assign next pointer */
        if (cur->buf.p != NULL) {
            if (cur->next != NULL) {
                return MBEDTLS_ERR_X509_INVALID_EXTENSIONS;
            }

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_asn1_sequence));

            if (cur->next == NULL) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                         MBEDTLS_ERR_ASN1_ALLOC_FAILED);
            }

            cur = cur->next;
        }

        cur->buf = tmp_san_buf;
        *p += tmp_san_buf.len;
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}